

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Cluster::Parse(Cluster *this,longlong *pos,long *len)

{
  int iVar1;
  longlong lVar2;
  longlong lVar3;
  longlong *block_size;
  longlong *pos_00;
  long *plVar4;
  long lVar5;
  longlong *in_RDX;
  Cluster *in_RSI;
  IMkvReader *in_RDI;
  longlong stop;
  longlong size_1;
  longlong start;
  Block *pBlock;
  BlockEntry *pLast;
  long idx;
  Cluster *this_;
  longlong block_stop;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result;
  longlong avail;
  longlong total;
  IMkvReader *pReader;
  longlong cluster_stop;
  long status;
  Segment *local_b8;
  long *in_stack_ffffffffffffff58;
  longlong in_stack_ffffffffffffff60;
  IMkvReader *in_stack_ffffffffffffff68;
  longlong in_stack_ffffffffffffff70;
  IMkvReader *in_stack_ffffffffffffff78;
  longlong in_stack_ffffffffffffff80;
  IMkvReader *in_stack_ffffffffffffff88;
  long local_48;
  Segment *in_stack_ffffffffffffffc0;
  _func_int *pos_01;
  long *in_stack_ffffffffffffffd8;
  Cluster *local_8;
  
  local_8 = (Cluster *)Load(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
  if (-1 < (long)local_8) {
    if (((long)in_RDI[3]._vptr_IMkvReader < (long)in_RDI[1]._vptr_IMkvReader) ||
       ((long)in_RDI[5]._vptr_IMkvReader < 0)) {
      local_8 = (Cluster *)0xffffffffffffffff;
    }
    else {
      if ((long)in_RDI[4]._vptr_IMkvReader < 0) {
        local_b8 = (Segment *)0xffffffffffffffff;
      }
      else {
        local_b8 = (Segment *)((long)in_RDI[1]._vptr_IMkvReader + (long)in_RDI[4]._vptr_IMkvReader);
      }
      if (((long)local_b8 < 0) || ((long)in_RDI[3]._vptr_IMkvReader < (long)local_b8)) {
        pos_01 = *in_RDI->_vptr_IMkvReader;
        iVar1 = (**(code **)(*(long *)pos_01 + 8))(pos_01,&stack0xffffffffffffffc0,&local_48);
        local_8 = (Cluster *)(long)iVar1;
        if (-1 < (long)local_8) {
          if (((long)in_stack_ffffffffffffffc0 < 0) || (local_48 <= (long)in_stack_ffffffffffffffc0)
             ) {
            in_RSI->m_pSegment = (Segment *)in_RDI[3]._vptr_IMkvReader;
            do {
              do {
                if ((-1 < (long)local_b8) && ((long)local_b8 <= (long)in_RSI->m_pSegment)) {
LAB_0018afd3:
                  if ((long)in_RDI[4]._vptr_IMkvReader < 1) {
                    return -2;
                  }
                  in_RDI[3]._vptr_IMkvReader = (_func_int **)in_RSI->m_pSegment;
                  if ((-1 < (long)local_b8) && ((long)local_b8 < (long)in_RDI[3]._vptr_IMkvReader))
                  {
                    return -2;
                  }
                  if (0 < (long)in_RDI[8]._vptr_IMkvReader) {
                    if (in_RDI[6]._vptr_IMkvReader[(long)in_RDI[8]._vptr_IMkvReader + -1] ==
                        (_func_int *)0x0) {
                      return -1;
                    }
                    plVar4 = (long *)(**(code **)(*(long *)in_RDI[6]._vptr_IMkvReader
                                                           [(long)in_RDI[8]._vptr_IMkvReader + -1] +
                                                 0x10))();
                    if (plVar4 == (long *)0x0) {
                      return -1;
                    }
                    if ((-1 < (long)in_stack_ffffffffffffffc0) &&
                       ((long)in_stack_ffffffffffffffc0 < *plVar4)) {
                      return -1;
                    }
                    lVar5 = *plVar4 + plVar4[1];
                    if ((-1 < (long)local_b8) && ((long)local_b8 < lVar5)) {
                      return -2;
                    }
                    if ((-1 < (long)in_stack_ffffffffffffffc0) &&
                       ((long)in_stack_ffffffffffffffc0 < lVar5)) {
                      return -1;
                    }
                  }
                  return 1;
                }
                if ((-1 < (long)in_stack_ffffffffffffffc0) &&
                   ((long)in_stack_ffffffffffffffc0 <= (long)in_RSI->m_pSegment)) {
                  if ((long)in_RDI[4]._vptr_IMkvReader < 0) {
                    in_RDI[4]._vptr_IMkvReader =
                         (_func_int **)((long)in_RSI->m_pSegment - (long)in_RDI[1]._vptr_IMkvReader)
                    ;
                  }
                  goto LAB_0018afd3;
                }
                if (local_48 < (long)((long)&in_RSI->m_pSegment->m_pReader + 1)) {
                  *in_RDX = 1;
                  return -3;
                }
                lVar2 = GetUIntLength(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                      in_stack_ffffffffffffff58);
                if (lVar2 < 0) {
                  return lVar2;
                }
                if (0 < lVar2) {
                  return -3;
                }
                if ((-1 < (long)local_b8) &&
                   ((long)local_b8 < (long)&in_RSI->m_pSegment->m_pReader + *in_RDX)) {
                  return -2;
                }
                if (local_48 < (long)&in_RSI->m_pSegment->m_pReader + *in_RDX) {
                  return -3;
                }
                lVar2 = ReadID(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                               (long *)in_stack_ffffffffffffff78);
                if (lVar2 < 0) {
                  return -2;
                }
                if ((lVar2 == 0x1f43b675) || (lVar2 == 0x1c53bb6b)) {
                  if ((long)in_RDI[4]._vptr_IMkvReader < 0) {
                    in_RDI[4]._vptr_IMkvReader =
                         (_func_int **)((long)in_RSI->m_pSegment - (long)in_RDI[1]._vptr_IMkvReader)
                    ;
                  }
                  goto LAB_0018afd3;
                }
                in_RSI->m_pSegment = (Segment *)((long)&in_RSI->m_pSegment->m_pReader + *in_RDX);
                if (local_48 < (long)((long)&in_RSI->m_pSegment->m_pReader + 1)) {
                  *in_RDX = 1;
                  return -3;
                }
                lVar3 = GetUIntLength(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                                      in_stack_ffffffffffffff58);
                if (lVar3 < 0) {
                  return lVar3;
                }
                if (0 < lVar3) {
                  return -3;
                }
                if ((-1 < (long)local_b8) &&
                   ((long)local_b8 < (long)&in_RSI->m_pSegment->m_pReader + *in_RDX)) {
                  return -2;
                }
                if (local_48 < (long)&in_RSI->m_pSegment->m_pReader + *in_RDX) {
                  return -3;
                }
                block_size = (longlong *)
                             ReadUInt(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                      (long *)in_stack_ffffffffffffff68);
                if ((long)block_size < 0) {
                  return (long)block_size;
                }
                pos_00 = (longlong *)((1L << ((char)*in_RDX * '\a' & 0x3fU)) + -1);
                if (block_size == pos_00) {
                  return -2;
                }
                in_RSI->m_pSegment = (Segment *)((long)&in_RSI->m_pSegment->m_pReader + *in_RDX);
                if ((-1 < (long)local_b8) && ((long)local_b8 < (long)in_RSI->m_pSegment)) {
                  return -2;
                }
              } while (block_size == (longlong *)0x0);
              plVar4 = (long *)((long)block_size + (long)in_RSI->m_pSegment);
              if ((long)local_b8 < 0) {
                if ((-1 < (long)in_stack_ffffffffffffffc0) &&
                   ((long)in_stack_ffffffffffffffc0 < (long)plVar4)) {
                  in_RDI[4]._vptr_IMkvReader =
                       (_func_int **)
                       ((long)in_stack_ffffffffffffffc0 - (long)in_RDI[1]._vptr_IMkvReader);
                  in_RSI->m_pSegment = in_stack_ffffffffffffffc0;
                  goto LAB_0018afd3;
                }
                if (local_48 < (long)plVar4) {
                  *in_RDX = (longlong)block_size;
                  return -3;
                }
              }
              else if ((long)local_b8 < (long)plVar4) {
                if ((lVar2 == 0xa0) || (lVar2 == 0xa3)) {
                  return -2;
                }
                in_RSI->m_pSegment = local_b8;
                goto LAB_0018afd3;
              }
              if (lVar2 == 0xa0) {
                lVar5 = ParseBlockGroup(local_8,(longlong)local_b8,(longlong *)pos_01,
                                        (long *)in_stack_ffffffffffffffc0);
                return lVar5;
              }
              if (lVar2 == 0xa3) {
                lVar5 = ParseSimpleBlock((Cluster *)0xa3,(longlong)block_size,pos_00,plVar4);
                return lVar5;
              }
              in_RSI->m_pSegment = (Segment *)((long)block_size + (long)in_RSI->m_pSegment);
              in_stack_ffffffffffffff88 = in_RDI;
            } while (((long)local_b8 < 0) || ((long)in_RSI->m_pSegment <= (long)local_b8));
            local_8 = (Cluster *)0xfffffffffffffffe;
          }
          else {
            local_8 = (Cluster *)0xfffffffffffffffe;
          }
        }
      }
      else {
        local_8 = (Cluster *)0x1;
      }
    }
  }
  return (long)local_8;
}

Assistant:

long Cluster::Parse(long long& pos, long& len) const {
  long status = Load(pos, len);

  if (status < 0)
    return status;

  if (m_pos < m_element_start || m_timecode < 0)
    return E_PARSE_FAILED;

  const long long cluster_stop =
      (m_element_size < 0) ? -1 : m_element_start + m_element_size;

  if ((cluster_stop >= 0) && (m_pos >= cluster_stop))
    return 1;  // nothing else to do

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  if (total >= 0 && avail > total)
    return E_FILE_FORMAT_INVALID;

  pos = m_pos;

  for (;;) {
    if ((cluster_stop >= 0) && (pos >= cluster_stop))
      break;

    if ((total >= 0) && (pos >= total)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    // Parse ID

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadID(pReader, pos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    // This is the distinguished set of ID's we use to determine
    // that we have exhausted the sub-element's inside the cluster
    // whose ID we parsed earlier.

    if ((id == libwebm::kMkvCluster) || (id == libwebm::kMkvCues)) {
      if (m_element_size < 0)
        m_element_size = pos - m_element_start;

      break;
    }

    pos += len;  // consume ID field

    // Parse Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)
      return E_BUFFER_NOT_FULL;

    if ((cluster_stop >= 0) && ((pos + len) > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume size field

    if ((cluster_stop >= 0) && (pos > cluster_stop))
      return E_FILE_FORMAT_INVALID;

    // pos now points to start of payload

    if (size == 0)
      continue;

    // const long long block_start = pos;
    const long long block_stop = pos + size;

    if (cluster_stop >= 0) {
      if (block_stop > cluster_stop) {
        if (id == libwebm::kMkvBlockGroup || id == libwebm::kMkvSimpleBlock) {
          return E_FILE_FORMAT_INVALID;
        }

        pos = cluster_stop;
        break;
      }
    } else if ((total >= 0) && (block_stop > total)) {
      m_element_size = total - m_element_start;
      pos = total;
      break;
    } else if (block_stop > avail) {
      len = static_cast<long>(size);
      return E_BUFFER_NOT_FULL;
    }

    Cluster* const this_ = const_cast<Cluster*>(this);

    if (id == libwebm::kMkvBlockGroup)
      return this_->ParseBlockGroup(size, pos, len);

    if (id == libwebm::kMkvSimpleBlock)
      return this_->ParseSimpleBlock(size, pos, len);

    pos += size;  // consume payload
    if (cluster_stop >= 0 && pos > cluster_stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (m_element_size < 1)
    return E_FILE_FORMAT_INVALID;

  m_pos = pos;
  if (cluster_stop >= 0 && m_pos > cluster_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_entries_count > 0) {
    const long idx = m_entries_count - 1;

    const BlockEntry* const pLast = m_entries[idx];
    if (pLast == NULL)
      return E_PARSE_FAILED;

    const Block* const pBlock = pLast->GetBlock();
    if (pBlock == NULL)
      return E_PARSE_FAILED;

    const long long start = pBlock->m_start;

    if ((total >= 0) && (start > total))
      return E_PARSE_FAILED;  // defend against trucated stream

    const long long size = pBlock->m_size;

    const long long stop = start + size;
    if (cluster_stop >= 0 && stop > cluster_stop)
      return E_FILE_FORMAT_INVALID;

    if ((total >= 0) && (stop > total))
      return E_PARSE_FAILED;  // defend against trucated stream
  }

  return 1;  // no more entries
}